

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  uint i;
  int pc;
  undefined8 in_RAX;
  char *pcVar1;
  int isup;
  int lastpc_local;
  int local_24;
  
  _lastpc_local = CONCAT44((int)((ulong)in_RAX >> 0x20),lastpc);
  pcVar1 = basicgetobjname(p,&lastpc_local,reg,name);
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  pc = lastpc_local;
  if ((long)lastpc_local == -1) {
    return (char *)0x0;
  }
  i = p->code[lastpc_local];
  pcVar1 = (char *)0x0;
  switch(i & 0x7f) {
  case 0xb:
    kname(p,i >> 0x18,name);
    isup = 1;
    goto LAB_0010a3d6;
  case 0xc:
    _lastpc_local = CONCAT44(lastpc_local,lastpc_local);
    pcVar1 = basicgetobjname(p,&local_24,i >> 0x18,name);
    if ((pcVar1 == (char *)0x0) || (*pcVar1 != 'c')) {
      *name = "?";
    }
    goto LAB_0010a3cc;
  case 0xd:
    *name = "integer index";
    pcVar1 = "field";
    break;
  case 0xe:
    kname(p,i >> 0x18,name);
LAB_0010a3cc:
    isup = 0;
LAB_0010a3d6:
    pcVar1 = isEnv(p,pc,i,isup);
    return pcVar1;
  case 0x14:
    kname(p,i >> 0x18,name);
    pcVar1 = "method";
  }
  return pcVar1;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  const char *kind = basicgetobjname(p, &lastpc, reg, name);
  if (kind != NULL)
    return kind;
  else if (lastpc != -1) {  /* could find instruction? */
    Instruction i = p->code[lastpc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, lastpc, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_SELF: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}